

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O2

LazyJSONString *
Js::JSONStringifier::Stringify(ScriptContext *scriptContext,Var value,Var replacer,Var space)

{
  DWORD *this;
  JavascriptLibrary *javascriptLibrary;
  charcount_t length;
  charcount_t gapLength;
  PropertyId propertyId;
  ScriptContextPolymorphicInlineCache *ptr;
  Recycler *alloc;
  JSONProperty *prop;
  DynamicObject *instance;
  JavascriptString *key;
  Recycler *pRVar1;
  LazyJSONString *this_00;
  StaticType *type;
  undefined1 local_c0 [8];
  TrackAllocData data_1;
  JSONStringifier stringifier;
  JSONObjectStack objStack;
  
  pRVar1 = scriptContext->recycler;
  javascriptLibrary = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  if ((javascriptLibrary->cache).toJSONCache.ptr == (ScriptContextPolymorphicInlineCache *)0x0) {
    ptr = ScriptContextPolymorphicInlineCache::New(0x20,javascriptLibrary);
    Memory::WriteBarrierPtr<Js::ScriptContextPolymorphicInlineCache>::WriteBarrierSet
              (&(((scriptContext->super_ScriptContextBase).javascriptLibrary)->cache).toJSONCache,
               ptr);
  }
  data_1._32_8_ = &JSONProperty::typeinfo;
  stringifier.scriptContext = (ScriptContext *)0x0;
  stringifier.replacerFunction = (RecyclableObject *)0xffffffffffffffff;
  stringifier.propertyList = (PropertyList *)anon_var_dwarf_68a3be2;
  stringifier.totalStringLength = 0xb3;
  alloc = Memory::Recycler::TrackAllocInfo(pRVar1,(TrackAllocData *)&data_1.line);
  instance = (DynamicObject *)0x0;
  prop = (JSONProperty *)new<Memory::Recycler>(0x18,alloc,0x37a1d4);
  *(undefined8 *)prop = 0;
  (prop->field_1).numericValue.value.ptr = (void *)0x0;
  (prop->field_1).numericValue.string.ptr = (JavascriptString *)0x0;
  stringifier.gap = (char16 *)0x0;
  this = &data_1.line;
  JSONStringifier((JSONStringifier *)this,scriptContext);
  ReadReplacer((JSONStringifier *)this,replacer);
  ReadSpace((JSONStringifier *)this,space);
  if (stringifier.scriptContext != (ScriptContext *)0x0) {
    instance = JavascriptLibrary::CreateObject(javascriptLibrary,false,0);
    propertyId = ScriptContext::GetEmptyStringPropertyId(scriptContext);
    JavascriptOperators::InitProperty
              (&instance->super_RecyclableObject,propertyId,value,PropertyOperation_None);
  }
  key = JavascriptLibrary::GetEmptyString(javascriptLibrary);
  ReadProperty((JSONStringifier *)&data_1.line,key,&instance->super_RecyclableObject,prop,value,
               (JSONObjectStack *)&stringifier.gap);
  if (prop->type == Undefined) {
    this_00 = (LazyJSONString *)0x0;
  }
  else {
    local_c0 = (undefined1  [8])&LazyJSONString::typeinfo;
    data_1.typeinfo = (type_info *)0x0;
    data_1.plusSize = 0xffffffffffffffff;
    data_1.count = (size_t)anon_var_dwarf_68a3be2;
    data_1.filename._0_4_ = 0xd8;
    pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,(TrackAllocData *)local_c0);
    this_00 = (LazyJSONString *)new<Memory::Recycler>(0x30,pRVar1,0x37a1d4);
    gapLength = stringifier.totalStringLength;
    length = (charcount_t)stringifier.propertyList;
    type = StringCache::GetStringTypeStatic(&javascriptLibrary->stringCache);
    LazyJSONString::LazyJSONString(this_00,prop,length,(char16 *)stringifier._32_8_,gapLength,type);
  }
  return this_00;
}

Assistant:

LazyJSONString*
JSONStringifier::Stringify(_In_ ScriptContext* scriptContext, _In_ Var value, _In_opt_ Var replacer, _In_opt_ Var space)
{
    Recycler* recycler = scriptContext->GetRecycler();
    JavascriptLibrary* library = scriptContext->GetLibrary();

    if (scriptContext->Cache()->toJSONCache == nullptr)
    {
        scriptContext->Cache()->toJSONCache = ScriptContextPolymorphicInlineCache::New(32, library);
    }

    JSONProperty* prop = RecyclerNewStruct(recycler, JSONProperty);
    JSONObjectStack objStack = { 0 };

    JSONStringifier stringifier(scriptContext);

    stringifier.ReadReplacer(replacer);
    stringifier.ReadSpace(space);

    DynamicObject* wrapper = nullptr;
    if (stringifier.HasReplacerFunction())
    {
        // ReplacerFunction takes wrapper object as a parameter, so we need to materialize it (otherwise it isn't needed)
        wrapper = library->CreateObject();
        PropertyId propertyId = scriptContext->GetEmptyStringPropertyId();
        JavascriptOperators::InitProperty(wrapper, propertyId, value);
    }

    stringifier.ReadProperty(
        library->GetEmptyString(),
        wrapper,
        prop,
        value,
        &objStack);

    if (prop->type == JSONContentType::Undefined)
    {
        return nullptr;
    }
    else
    {
        return RecyclerNew(
            recycler,
            LazyJSONString,
            prop,
            stringifier.totalStringLength,
            stringifier.GetGap(),
            stringifier.GetGapLength(),
            library->GetStringTypeStatic());
    }
}